

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O0

void Inta_ManPrepareInter(Inta_Man_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t **ppAVar3;
  bool bVar4;
  int local_24;
  int v;
  int VarAB;
  int Var;
  Sto_Cls_t *pClause;
  Inta_Man_t *p_local;
  
  _VarAB = p->pCnf->pHead;
  while( true ) {
    bVar4 = false;
    if (_VarAB != (Sto_Cls_t *)0x0) {
      bVar4 = (*(uint *)&_VarAB->field_0x1c >> 1 & 1) != 0;
    }
    if (!bVar4) break;
    if ((*(uint *)&_VarAB->field_0x1c & 1) == 0) {
      ppAVar3 = Inta_ManAigRead(p,_VarAB);
      Inta_ManAigFill(p,ppAVar3);
    }
    else {
      ppAVar3 = Inta_ManAigRead(p,_VarAB);
      Inta_ManAigClear(p,ppAVar3);
      for (local_24 = 0; local_24 < (int)(*(uint *)&_VarAB->field_0x1c >> 3 & 0xffffff);
          local_24 = local_24 + 1) {
        iVar1 = lit_var(*(lit *)((long)&_VarAB[1].pNext + (long)local_24 * 4));
        if (p->pVarTypes[iVar1] < 0) {
          iVar1 = -1 - p->pVarTypes[iVar1];
          if ((iVar1 < 0) || (iVar2 = Vec_IntSize(p->vVarsAB), iVar2 <= iVar1)) {
            __assert_fail("VarAB >= 0 && VarAB < Vec_IntSize(p->vVarsAB)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                          ,0x397,"void Inta_ManPrepareInter(Inta_Man_t *)");
          }
          iVar2 = lit_sign(*(lit *)((long)&_VarAB[1].pNext + (long)local_24 * 4));
          if (iVar2 == 0) {
            ppAVar3 = Inta_ManAigRead(p,_VarAB);
            Inta_ManAigOrVar(p,ppAVar3,iVar1);
          }
          else {
            ppAVar3 = Inta_ManAigRead(p,_VarAB);
            Inta_ManAigOrNotVar(p,ppAVar3,iVar1);
          }
        }
      }
    }
    _VarAB = _VarAB->pNext;
  }
  return;
}

Assistant:

void Inta_ManPrepareInter( Inta_Man_t * p )
{
    Sto_Cls_t * pClause;
    int Var, VarAB, v;

    // set interpolants for root clauses
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        if ( !pClause->fA ) // clause of B
        {
            Inta_ManAigFill( p, Inta_ManAigRead(p, pClause) );
//            Inta_ManPrintInterOne( p, pClause );
            continue;
        }
        // clause of A
        Inta_ManAigClear( p, Inta_ManAigRead(p, pClause) );
        for ( v = 0; v < (int)pClause->nLits; v++ )
        {
            Var = lit_var(pClause->pLits[v]);
            if ( p->pVarTypes[Var] < 0 ) // global var
            {
                VarAB = -p->pVarTypes[Var]-1;
                assert( VarAB >= 0 && VarAB < Vec_IntSize(p->vVarsAB) );
                if ( lit_sign(pClause->pLits[v]) ) // negative var
                    Inta_ManAigOrNotVar( p, Inta_ManAigRead(p, pClause), VarAB );
                else
                    Inta_ManAigOrVar( p, Inta_ManAigRead(p, pClause), VarAB );
            }
        }
//        Inta_ManPrintInterOne( p, pClause );
    }
}